

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O1

void __thiscall AnalyserUnits_rem_Test::TestBody(AnalyserUnits_rem_Test *this)

{
  char cVar1;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_564;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  ModelPtr model;
  ParserPtr parser;
  AnalyserPtr analyser;
  ScopedTrace local_109;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  undefined1 local_f8 [32];
  string local_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long *local_38 [2];
  long local_28 [2];
  
  libcellml::Parser::create(SUB81(local_c8,0));
  local_f8._0_8_ = (pointer)(local_f8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"analyser/units/rem.cellml","")
  ;
  fileContents((string *)&local_b8);
  libcellml::Parser::parseModel(local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_f8._16_8_)->_M_p + 1));
  }
  local_f8._0_8_ = (pointer)0x0;
  local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_b8,"size_t(0)","parser->issueCount()",(unsigned_long *)local_f8,
             (unsigned_long *)&local_108);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(undefined1 *)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x226,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((pointer)local_f8._0_8_ != (pointer)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((pointer)local_f8._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_f8._0_8_)->_M_p + 8))();
      }
      local_f8._0_8_ = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "The units in \'rem(bCst, 3.0)\' in equation \'b = rem(bCst, 3.0)\' in component \'main\' are not equivalent. \'bCst\' is in \'second\' while \'3.0\' is \'dimensionless\'."
             ,"");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "The units in \'rem(cCst, 5.0)\' in equation \'c = rem(cCst, 5.0)\' in component \'main\' are not equivalent. \'cCst\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\') while \'5.0\' is \'dimensionless\'."
             ,"");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "The units in \'rem(dCst, 7.0)\' in equation \'d = rem(dCst, 7.0)\' in component \'main\' are not equivalent. \'dCst\' is in \'frog\' while \'7.0\' is \'dimensionless\'."
             ,"");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "The units in \'rem(eCst, 9.0)\' in equation \'e = rem(eCst, 9.0)\' in component \'main\' are not equivalent. \'eCst\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\') while \'9.0\' is \'dimensionless\'."
             ,"");
  plVar2 = local_28;
  local_38[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,
             "The units in \'rem(fCst, 11.0)\' in equation \'f = rem(fCst, 11.0)\' in component \'main\' are not equivalent. \'fCst\' is in \'second\' while \'11.0\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
             ,"");
  __l._M_len = 5;
  __l._M_array = &local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f8,__l,(allocator_type *)&local_108);
  lVar4 = -0xa0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel((shared_ptr *)local_b8._M_dataplus._M_p);
  testing::ScopedTrace::ScopedTrace
            (&local_109,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x234,"Issue occurred here.");
  local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p;
  local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_b8._M_string_length + 8) = *(int *)(local_b8._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_b8._M_string_length + 8) = *(int *)(local_b8._M_string_length + 8) + 1;
    }
  }
  expectEqualIssues((vector *)local_f8,(shared_ptr *)&local_108);
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  testing::ScopedTrace::~ScopedTrace(&local_109);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  return;
}

Assistant:

TEST(AnalyserUnits, rem)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/units/rem.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "The units in 'rem(bCst, 3.0)' in equation 'b = rem(bCst, 3.0)' in component 'main' are not equivalent. 'bCst' is in 'second' while '3.0' is 'dimensionless'.",
        "The units in 'rem(cCst, 5.0)' in equation 'c = rem(cCst, 5.0)' in component 'main' are not equivalent. 'cCst' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3') while '5.0' is 'dimensionless'.",
        "The units in 'rem(dCst, 7.0)' in equation 'd = rem(dCst, 7.0)' in component 'main' are not equivalent. 'dCst' is in 'frog' while '7.0' is 'dimensionless'.",
        "The units in 'rem(eCst, 9.0)' in equation 'e = rem(eCst, 9.0)' in component 'main' are not equivalent. 'eCst' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16') while '9.0' is 'dimensionless'.",
        "The units in 'rem(fCst, 11.0)' in equation 'f = rem(fCst, 11.0)' in component 'main' are not equivalent. 'fCst' is in 'second' while '11.0' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}